

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

Bytes __thiscall Omega_h::filter_parents(Omega_h *this,Parents *c2p,Int parent_dim)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  uint uVar3;
  size_t sVar4;
  Bytes BVar5;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  uint local_f8;
  Write<signed_char> local_f0;
  Write<signed_char> filter;
  Write<signed_char> local_d0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  type f;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_a0,
                 ":");
  std::__cxx11::to_string(&local_c0,0x10a);
  std::operator+(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 &local_c0);
  begin_code("filter_parents",local_118._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_a0);
  pAVar1 = (c2p->parent_idx).write_.shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_118,"",(allocator *)&f);
  Write<signed_char>::Write(&filter,(LO)(sVar4 >> 2),&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  Parents::Parents(&f.c2p,c2p);
  f.parent_dim = parent_dim;
  Write<signed_char>::Write(&f.filter,&filter);
  pAVar1 = (c2p->parent_idx).write_.shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_119);
  std::operator+(&local_a0,&local_c0,":");
  std::__cxx11::to_string(&local_48,0x54);
  std::operator+(&local_118,&local_a0,&local_48);
  begin_code("parallel_for",local_118._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  uVar3 = (uint)(sVar4 >> 2);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Parents::Parents((Parents *)&local_118,&f.c2p);
    local_f8 = f.parent_dim;
    Write<signed_char>::Write(&local_f0,&f.filter);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(bool *)((long)local_f0.shared_alloc_.direct_ptr + uVar2) =
           local_f8 == (*(byte *)(local_118.field_2._8_8_ + uVar2) & 3);
    }
    filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)&local_118);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  Write<signed_char>::Write(&local_d0,&filter);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d0);
  Write<signed_char>::~Write(&local_d0);
  filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)&f);
  Write<signed_char>::~Write(&filter);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  BVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar5.write_.shared_alloc_;
}

Assistant:

Bytes filter_parents(Parents const c2p, Int const parent_dim) {
  OMEGA_H_TIME_FUNCTION;
  Write<Byte> filter(c2p.parent_idx.size());
  auto f = OMEGA_H_LAMBDA(LO c) {
    auto const code = c2p.codes[c];
    if (amr::code_parent_dim(code) == parent_dim)
      filter[c] = 1;
    else
      filter[c] = 0;
  };
  parallel_for(c2p.parent_idx.size(), std::move(f));
  return filter;
}